

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lad.cc
# Opt level: O3

InputGraph __thiscall
anon_unknown.dwarf_1369e9::read_any_lad
          (anon_unknown_dwarf_1369e9 *this,ifstream *infile,string *filename,bool directed,
          bool vertex_labels,bool edge_labels)

{
  bool bVar1;
  undefined4 uVar2;
  undefined4 b;
  undefined4 __val;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  istream *piVar8;
  void *pvVar9;
  int *piVar10;
  long lVar11;
  unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_> extraout_RAX;
  unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_> uVar12;
  GraphFileError *pGVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  undefined7 in_register_00000009;
  ulong uVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  uint uVar17;
  uint uVar18;
  size_type __n;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  uint __val_00;
  ifstream *piVar19;
  string_view l;
  string_view l_00;
  string_view l_01;
  string_view label;
  string rest;
  string before;
  string after;
  undefined1 local_c0 [32];
  anon_unknown_dwarf_1369e9 *local_a0;
  string *local_98;
  undefined1 local_90 [32];
  ifstream *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  _Base_ptr local_38;
  
  local_3c = CONCAT31(in_register_00000089,edge_labels);
  local_40 = (undefined4)CONCAT71(in_register_00000009,directed);
  local_44 = (undefined4)CONCAT71(in_register_00000081,vertex_labels);
  local_98 = filename;
  InputGraph::InputGraph((InputGraph *)this,0,vertex_labels,edge_labels);
  std::istream::operator>>((istream *)infile,(int *)local_c0);
  InputGraph::resize((InputGraph *)this,local_c0._0_4_);
  local_a0 = this;
  local_70 = infile;
  if (((byte)infile[*(long *)(*(long *)infile + -0x18) + 0x20] & 5) != 0) {
    pGVar13 = (GraphFileError *)__cxa_allocate_exception(0x30);
    local_c0._0_8_ = local_c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"error reading size","");
    GraphFileError::GraphFileError(pGVar13,local_98,(string *)local_c0,true);
    __cxa_throw(pGVar13,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
  }
  __val_00 = 0;
  while( true ) {
    iVar4 = InputGraph::size((InputGraph *)this);
    piVar19 = local_70;
    if (iVar4 <= (int)__val_00) break;
    uVar17 = 1;
    if (9 < __val_00) {
      uVar15 = (ulong)__val_00;
      uVar18 = 4;
      do {
        uVar17 = uVar18;
        uVar5 = (uint)uVar15;
        if (uVar5 < 100) {
          uVar17 = uVar17 - 2;
          goto LAB_0011e641;
        }
        if (uVar5 < 1000) {
          uVar17 = uVar17 - 1;
          goto LAB_0011e641;
        }
        if (uVar5 < 10000) goto LAB_0011e641;
        uVar15 = uVar15 / 10000;
        uVar18 = uVar17 + 4;
      } while (99999 < uVar5);
      uVar17 = uVar17 + 1;
    }
LAB_0011e641:
    local_c0._0_8_ = local_c0 + 0x10;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
               (ulong)uVar17,'-');
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_c0._0_8_,uVar17,__val_00);
    l._M_str = (char *)local_c0._0_8_;
    l._M_len = local_c0._8_8_;
    InputGraph::set_vertex_name((InputGraph *)this,__val_00,l);
    if ((Imp *)local_c0._0_8_ != (Imp *)(local_c0 + 0x10)) {
      operator_delete((void *)local_c0._0_8_,CONCAT71(local_c0._17_7_,local_c0[0x10]) + 1);
    }
    if ((char)local_44 != '\0') {
      std::istream::operator>>((istream *)piVar19,(int *)local_c0);
      if (((byte)((istream *)(piVar19 + 0x20))[*(long *)(*(long *)piVar19 + -0x18)] & 5) != 0)
      goto LAB_0011ec30;
      uVar18 = 1;
      uVar17 = -local_c0._0_4_;
      if (0 < (int)local_c0._0_4_) {
        uVar17 = local_c0._0_4_;
      }
      if (9 < uVar17) {
        uVar15 = (ulong)uVar17;
        uVar5 = 4;
        do {
          uVar18 = uVar5;
          uVar6 = (uint)uVar15;
          if (uVar6 < 100) {
            uVar18 = uVar18 - 2;
            goto LAB_0011e726;
          }
          if (uVar6 < 1000) {
            uVar18 = uVar18 - 1;
            goto LAB_0011e726;
          }
          if (uVar6 < 10000) goto LAB_0011e726;
          uVar15 = uVar15 / 10000;
          uVar5 = uVar18 + 4;
        } while (99999 < uVar6);
        uVar18 = uVar18 + 1;
      }
LAB_0011e726:
      iVar4 = (int)local_c0._0_4_ >> 0x1f;
      local_c0._0_8_ = local_c0 + 0x10;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                 (ulong)(uVar18 + -iVar4),'-');
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)(local_c0._0_8_ + (ulong)(uint)-iVar4),uVar18,uVar17);
      l_00._M_str = (char *)local_c0._0_8_;
      l_00._M_len = local_c0._8_8_;
      InputGraph::set_vertex_label((InputGraph *)this,__val_00,l_00);
      if ((Imp *)local_c0._0_8_ != (Imp *)(local_c0 + 0x10)) {
        operator_delete((void *)local_c0._0_8_,CONCAT71(local_c0._17_7_,local_c0[0x10]) + 1);
      }
    }
    std::istream::operator>>((istream *)piVar19,(int *)local_c0);
    if (((byte)((istream *)(piVar19 + 0x20))[*(long *)(*(long *)piVar19 + -0x18)] & 5) != 0) {
      pGVar13 = (GraphFileError *)__cxa_allocate_exception(0x30);
      local_c0._0_8_ = local_c0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c0,"error reading edges count","");
      GraphFileError::GraphFileError(pGVar13,local_98,(string *)local_c0,true);
      __cxa_throw(pGVar13,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
    }
    uVar2 = local_c0._0_4_;
    if (0 < (int)local_c0._0_4_) {
      iVar4 = 0;
      do {
        std::istream::operator>>((istream *)local_70,(int *)local_c0);
        b = local_c0._0_4_;
        if ((int)local_c0._0_4_ < 0) {
LAB_0011ea98:
          pGVar13 = (GraphFileError *)__cxa_allocate_exception(0x30);
          local_c0._0_8_ = local_c0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c0,"edge index out of bounds","");
          GraphFileError::GraphFileError(pGVar13,local_98,(string *)local_c0,true);
          __cxa_throw(pGVar13,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
        }
        iVar7 = InputGraph::size((InputGraph *)this);
        if (iVar7 <= (int)b) goto LAB_0011ea98;
        if ((char)local_3c == '\0') {
          if ((char)local_40 == '\0') {
            InputGraph::add_edge((InputGraph *)this,__val_00,b);
          }
          else {
            InputGraph::add_directed_edge
                      ((InputGraph *)this,__val_00,b,(string_view)(ZEXT816(0x11fe4a) << 0x40));
          }
        }
        else {
          std::istream::operator>>((istream *)local_70,(int *)local_c0);
          __val = local_c0._0_4_;
          if ((int)local_c0._0_4_ < 0) {
            pGVar13 = (GraphFileError *)__cxa_allocate_exception(0x30);
            local_c0._0_8_ = local_c0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_c0,"edge label invalid","");
            GraphFileError::GraphFileError(pGVar13,local_98,(string *)local_c0,true);
            __cxa_throw(pGVar13,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
          }
          uVar17 = 1;
          if (9 < (uint)local_c0._0_4_) {
            uVar18 = 4;
            do {
              uVar17 = uVar18;
              if ((uint)local_c0._0_4_ < 100) {
                uVar17 = uVar17 - 2;
                goto LAB_0011e88c;
              }
              if ((uint)local_c0._0_4_ < 1000) {
                uVar17 = uVar17 - 1;
                goto LAB_0011e88c;
              }
              if ((uint)local_c0._0_4_ < 10000) goto LAB_0011e88c;
              bVar1 = 99999 < (uint)local_c0._0_4_;
              local_c0._0_4_ = (uint)local_c0._0_4_ / 10000;
              uVar18 = uVar17 + 4;
            } while (bVar1);
            uVar17 = uVar17 + 1;
          }
LAB_0011e88c:
          local_c0._0_8_ = local_c0 + 0x10;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0
                       ,(ulong)uVar17,'-');
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_c0._0_8_,uVar17,__val);
          this = local_a0;
          label._M_str = (char *)local_c0._0_8_;
          label._M_len = local_c0._8_8_;
          InputGraph::add_directed_edge((InputGraph *)local_a0,__val_00,b,label);
          if ((Imp *)local_c0._0_8_ != (Imp *)(local_c0 + 0x10)) {
            operator_delete((void *)local_c0._0_8_,CONCAT71(local_c0._17_7_,local_c0[0x10]) + 1);
          }
        }
        iVar4 = iVar4 + 1;
      } while (iVar4 != uVar2);
    }
    __val_00 = __val_00 + 1;
  }
  local_c0._0_8_ = local_c0 + 0x10;
  local_c0._8_8_ = 0;
  local_c0[0x10] = '\0';
  while( true ) {
    piVar8 = std::operator>>((istream *)piVar19,(string *)local_c0);
    uVar3 = local_c0._0_8_;
    if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) {
      if (((byte)((istream *)piVar19 + 0x20)[*(long *)(*(long *)piVar19 + -0x18)] & 2) != 0) {
        uVar12._M_t.super___uniq_ptr_impl<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>.
        _M_t.super__Tuple_impl<0UL,_InputGraph::Imp_*,_std::default_delete<InputGraph::Imp>_>.
        super__Head_base<0UL,_InputGraph::Imp_*,_false>._M_head_impl =
             (__uniq_ptr_data<InputGraph::Imp,_std::default_delete<InputGraph::Imp>,_true,_true>)
             ((long)local_c0 + 0x10);
        if ((__uniq_ptr_data<InputGraph::Imp,_std::default_delete<InputGraph::Imp>,_true,_true>)
            local_c0._0_8_ !=
            (__uniq_ptr_impl<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)
            uVar12._M_t.
            super___uniq_ptr_impl<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>._M_t.
            super__Tuple_impl<0UL,_InputGraph::Imp_*,_std::default_delete<InputGraph::Imp>_>.
            super__Head_base<0UL,_InputGraph::Imp_*,_false>._M_head_impl) {
          operator_delete((void *)local_c0._0_8_,CONCAT71(local_c0._17_7_,local_c0[0x10]) + 1);
          uVar12._M_t.super___uniq_ptr_impl<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>.
          _M_t.super__Tuple_impl<0UL,_InputGraph::Imp_*,_std::default_delete<InputGraph::Imp>_>.
          super__Head_base<0UL,_InputGraph::Imp_*,_false>._M_head_impl =
               extraout_RAX._M_t.
               super___uniq_ptr_impl<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>._M_t.
               super__Tuple_impl<0UL,_InputGraph::Imp_*,_std::default_delete<InputGraph::Imp>_>.
               super__Head_base<0UL,_InputGraph::Imp_*,_false>._M_head_impl;
        }
        return (InputGraph)
               uVar12._M_t.
               super___uniq_ptr_impl<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>._M_t.
               super__Tuple_impl<0UL,_InputGraph::Imp_*,_std::default_delete<InputGraph::Imp>_>.
               super__Head_base<0UL,_InputGraph::Imp_*,_false>._M_head_impl;
      }
      pGVar13 = (GraphFileError *)__cxa_allocate_exception(0x30);
      local_90._0_8_ = local_90 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"EOF not reached","");
      GraphFileError::GraphFileError(pGVar13,local_98,(string *)local_90,true);
      __cxa_throw(pGVar13,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
    }
    if (local_c0._8_8_ == 0) break;
    pvVar9 = memchr((void *)local_c0._0_8_,0x3d,local_c0._8_8_);
    if ((pvVar9 == (void *)0x0) || (__n = (long)pvVar9 - uVar3, __n == 0xffffffffffffffff)) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,0,__n);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,__n + 1
               ,0xffffffffffffffff);
    uVar3 = local_90._0_8_;
    piVar10 = __errno_location();
    iVar4 = *piVar10;
    *piVar10 = 0;
    lVar11 = strtol((char *)uVar3,(char **)&local_38,10);
    if (local_38 == (_Base_ptr)uVar3) {
      std::__throw_invalid_argument("stoi");
LAB_0011ec24:
      std::__throw_out_of_range("stoi");
LAB_0011ec30:
      pGVar13 = (GraphFileError *)__cxa_allocate_exception(0x30);
      local_c0._0_8_ = local_c0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"error reading label","");
      GraphFileError::GraphFileError(pGVar13,local_98,(string *)local_c0,true);
      __cxa_throw(pGVar13,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
    }
    if (((int)lVar11 != lVar11) || (*piVar10 == 0x22)) goto LAB_0011ec24;
    if (*piVar10 == 0) {
      *piVar10 = iVar4;
    }
    l_01._M_str = local_68._M_dataplus._M_p;
    l_01._M_len = local_68._M_string_length;
    InputGraph::set_vertex_name((InputGraph *)local_a0,(int)lVar11,l_01);
    piVar19 = local_70;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((_Base_ptr)local_90._0_8_ != (_Base_ptr)(local_90 + 0x10)) {
      operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
    }
  }
  pGVar13 = (GraphFileError *)__cxa_allocate_exception(0x30);
  std::operator+(&local_68,"EOF not reached, next text is \"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
  pbVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_68,"\"");
  paVar16 = &pbVar14->field_2;
  local_90._0_8_ = (pbVar14->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._0_8_ == paVar16) {
    local_90._16_8_ = paVar16->_M_allocated_capacity;
    local_90._24_8_ = *(undefined8 *)((long)&pbVar14->field_2 + 8);
    local_90._0_8_ = local_90 + 0x10;
  }
  else {
    local_90._16_8_ = paVar16->_M_allocated_capacity;
  }
  local_90._8_8_ = pbVar14->_M_string_length;
  (pbVar14->_M_dataplus)._M_p = (pointer)paVar16;
  pbVar14->_M_string_length = 0;
  (pbVar14->field_2)._M_local_buf[0] = '\0';
  GraphFileError::GraphFileError(pGVar13,local_98,(string *)local_90,true);
  __cxa_throw(pGVar13,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
}

Assistant:

auto read_any_lad(ifstream && infile, const string & filename,
        bool directed,
        bool vertex_labels,
        bool edge_labels) -> InputGraph
    {
        InputGraph result{0, vertex_labels, edge_labels};

        result.resize(read_word(infile));
        if (! infile)
            throw GraphFileError{filename, "error reading size", true};

        for (int r = 0; r < result.size(); ++r) {
            result.set_vertex_name(r, to_string(r));

            if (vertex_labels) {
                int l = read_word(infile);
                if (! infile)
                    throw GraphFileError{filename, "error reading label", true};

                result.set_vertex_label(r, to_string(l));
            }

            int c_end = read_word(infile);
            if (! infile)
                throw GraphFileError{filename, "error reading edges count", true};

            for (int c = 0; c < c_end; ++c) {
                int e = read_word(infile);

                if (e < 0 || e >= result.size())
                    throw GraphFileError{filename, "edge index out of bounds", true};

                if (edge_labels) {
                    int l = read_word(infile);
                    if (l < 0)
                        throw GraphFileError{filename, "edge label invalid", true};

                    result.add_directed_edge(r, e, to_string(l));
                }
                else if (directed)
                    result.add_directed_edge(r, e, "");
                else
                    result.add_edge(r, e);
            }
        }

        string rest;
        while (infile >> rest) {
            auto equals_pos = rest.find('=');
            if (string::npos == equals_pos)
                throw GraphFileError{filename, "EOF not reached, next text is \"" + rest + "\"", true};
            else {
                string before = rest.substr(0, equals_pos), after = rest.substr(equals_pos + 1);
                result.set_vertex_name(stoi(before), after);
            }
        }
        if (! infile.eof())
            throw GraphFileError{filename, "EOF not reached", true};

        return result;
    }